

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_145302::DirectoryContentsTask::inputsAvailable
          (DirectoryContentsTask *this,TaskInterface ti)

{
  FileInfo directoryInfo;
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *filenames_00;
  FileInfo *__src;
  StringRef path;
  error_code eVar2;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_370;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  BuildValue local_310;
  ValueType local_2a0;
  DirectoryContentsTask *local_288;
  int local_278;
  error_code ec;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  ValueType local_1e0;
  BuildValue local_1c8;
  ValueType local_158;
  BuildValue local_140;
  ValueType local_d0;
  BuildValue local_b8;
  ValueType local_48;
  DirectoryContentsTask *local_30;
  DirectoryContentsTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (DirectoryContentsTask *)ti.impl;
  local_30 = this;
  bVar1 = llbuild::buildsystem::BuildValue::isMissingInput(&this->directoryValue);
  if (bVar1) {
    llbuild::buildsystem::BuildValue::makeMissingInput();
    llbuild::buildsystem::BuildValue::toData(&local_48,&local_b8);
    llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_48,false);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_48);
    llbuild::buildsystem::BuildValue::~BuildValue(&local_b8);
  }
  else {
    bVar1 = llbuild::buildsystem::BuildValue::isMissingOutput(&this->directoryValue);
    if (bVar1) {
      llbuild::buildsystem::BuildValue::makeMissingInput();
      llbuild::buildsystem::BuildValue::toData(&local_d0,&local_140);
      llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_d0,false);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_d0);
      llbuild::buildsystem::BuildValue::~BuildValue(&local_140);
    }
    else {
      bVar1 = llbuild::buildsystem::BuildValue::isFailedInput(&this->directoryValue);
      if (bVar1) {
        llbuild::buildsystem::BuildValue::makeFailedInput();
        llbuild::buildsystem::BuildValue::toData(&local_158,&local_1c8);
        llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_158,false);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_158);
        llbuild::buildsystem::BuildValue::~BuildValue(&local_1c8);
      }
      else {
        bVar1 = llbuild::buildsystem::BuildValue::isSkippedCommand(&this->directoryValue);
        if (bVar1) {
          llbuild::buildsystem::BuildValue::makeSkippedCommand();
          llbuild::buildsystem::BuildValue::toData
                    (&local_1e0,
                     (BuildValue *)
                     &filenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_1e0,false);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1e0);
          llbuild::buildsystem::BuildValue::~BuildValue
                    ((BuildValue *)
                     &filenames.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        else {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&ec._M_cat);
          ti_local.ctx = &this->path;
          local_288 = (DirectoryContentsTask *)std::__cxx11::string::data();
          filenames_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)std::__cxx11::string::length();
          path.Length = (size_t)&ec._M_cat;
          path.Data = (char *)filenames_00;
          eVar2 = getContents(local_288,path,filenames_00);
          ec._0_8_ = eVar2._M_cat;
          local_278 = eVar2._M_value;
          __src = llbuild::buildsystem::BuildValue::getOutputInfo(&this->directoryValue);
          memcpy(&local_360,__src,0x50);
          llvm::ArrayRef<std::__cxx11::string>::ArrayRef<std::allocator<std::__cxx11::string>>
                    ((ArrayRef<std::__cxx11::string> *)&local_370,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&ec._M_cat);
          directoryInfo.inode = uStack_358;
          directoryInfo.device = local_360;
          directoryInfo.mode = local_350;
          directoryInfo.size = uStack_348;
          directoryInfo.modTime.seconds = local_340;
          directoryInfo.modTime.nanoseconds = uStack_338;
          directoryInfo.checksum.bytes[0] = (undefined1)local_330;
          directoryInfo.checksum.bytes[1] = local_330._1_1_;
          directoryInfo.checksum.bytes[2] = local_330._2_1_;
          directoryInfo.checksum.bytes[3] = local_330._3_1_;
          directoryInfo.checksum.bytes[4] = local_330._4_1_;
          directoryInfo.checksum.bytes[5] = local_330._5_1_;
          directoryInfo.checksum.bytes[6] = local_330._6_1_;
          directoryInfo.checksum.bytes[7] = local_330._7_1_;
          directoryInfo.checksum.bytes[8] = (undefined1)uStack_328;
          directoryInfo.checksum.bytes[9] = uStack_328._1_1_;
          directoryInfo.checksum.bytes[10] = uStack_328._2_1_;
          directoryInfo.checksum.bytes[0xb] = uStack_328._3_1_;
          directoryInfo.checksum.bytes[0xc] = uStack_328._4_1_;
          directoryInfo.checksum.bytes[0xd] = uStack_328._5_1_;
          directoryInfo.checksum.bytes[0xe] = uStack_328._6_1_;
          directoryInfo.checksum.bytes[0xf] = uStack_328._7_1_;
          directoryInfo.checksum.bytes[0x10] = (undefined1)local_320;
          directoryInfo.checksum.bytes[0x11] = local_320._1_1_;
          directoryInfo.checksum.bytes[0x12] = local_320._2_1_;
          directoryInfo.checksum.bytes[0x13] = local_320._3_1_;
          directoryInfo.checksum.bytes[0x14] = local_320._4_1_;
          directoryInfo.checksum.bytes[0x15] = local_320._5_1_;
          directoryInfo.checksum.bytes[0x16] = local_320._6_1_;
          directoryInfo.checksum.bytes[0x17] = local_320._7_1_;
          directoryInfo.checksum.bytes[0x18] = (undefined1)uStack_318;
          directoryInfo.checksum.bytes[0x19] = uStack_318._1_1_;
          directoryInfo.checksum.bytes[0x1a] = uStack_318._2_1_;
          directoryInfo.checksum.bytes[0x1b] = uStack_318._3_1_;
          directoryInfo.checksum.bytes[0x1c] = uStack_318._4_1_;
          directoryInfo.checksum.bytes[0x1d] = uStack_318._5_1_;
          directoryInfo.checksum.bytes[0x1e] = uStack_318._6_1_;
          directoryInfo.checksum.bytes[0x1f] = uStack_318._7_1_;
          llbuild::buildsystem::BuildValue::makeDirectoryContents
                    (&local_310,directoryInfo,local_370);
          llbuild::buildsystem::BuildValue::toData(&local_2a0,&local_310);
          llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_2a0,false);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_2a0);
          llbuild::buildsystem::BuildValue::~BuildValue(&local_310);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&ec._M_cat);
        }
      }
    }
  }
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    // FIXME: We should do this work in the background.
    
    if (directoryValue.isMissingInput()) {
      ti.complete(BuildValue::makeMissingInput().toData());
      return;
    }

    if (directoryValue.isMissingOutput()) {
      // Rewrite a missing output as a missing input build value for this node, both conceptually and as a hedge against violating the downstream expectations of other rules.
      ti.complete(BuildValue::makeMissingInput().toData());
      return;
    }

    if (directoryValue.isFailedInput()) {
      ti.complete(BuildValue::makeFailedInput().toData());
      return;
    }

    // The input directory may be a 'mkdir' command, which can be cancelled or
    // skipped by the engine or the delegate. rdar://problem/50380532
    if (directoryValue.isSkippedCommand()) {
      ti.complete(BuildValue::makeSkippedCommand().toData());
      return;
    }

    std::vector<std::string> filenames;
    std::error_code ec = getContents(path, filenames);

    // Currently, tests and presumably clients expect that errors are silently
    // ignored when reading directory contents listings.
    (void)ec;

    // Create the result.
    ti.complete(BuildValue::makeDirectoryContents(directoryValue.getOutputInfo(),
                                                  filenames).toData());
  }